

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O0

vector<bool,_std::allocator<bool>_> * __thiscall OpenMD::SelectionSet::none(SelectionSet *this)

{
  byte bVar1;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  reference rVar2;
  OpenMDBitSet *in_stack_00000010;
  int i;
  vector<bool,_std::allocator<bool>_> *result;
  allocator_type *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  reference local_38;
  int local_28;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x3814a9);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98
             ,in_stack_ffffffffffffff90);
  std::allocator<bool>::~allocator((allocator<bool> *)0x3814c9);
  for (local_28 = 0; local_28 < 6; local_28 = local_28 + 1) {
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)in_RSI,
               (long)local_28);
    bVar1 = OpenMDBitSet::none(in_stack_00000010);
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RSI,(size_type)in_RDI);
    local_38 = rVar2;
    std::_Bit_reference::operator=(&local_38,(bool)(bVar1 & 1));
  }
  return in_RDI;
}

Assistant:

std::vector<bool> SelectionSet::none() {
    std::vector<bool> result(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].none();
    return result;
  }